

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslserver.cpp
# Opt level: O2

void __thiscall
QSslServerPrivate::handleHandshakeTimedOut(QSslServerPrivate *this,QSslSocket *socket)

{
  QTcpServer *this_00;
  char cVar1;
  int iVar2;
  
  this_00 = *(QTcpServer **)&(this->super_QTcpServerPrivate).field_0x8;
  removeSocketData(this,(quintptr)socket);
  (**(code **)(*(long *)&(socket->super_QTcpSocket).super_QAbstractSocket + 0x100))(socket);
  QSslServer::errorOccurred((QSslServer *)this_00,socket,SocketTimeoutError);
  QObject::deleteLater();
  cVar1 = (**(code **)(*(long *)(this->super_QTcpServerPrivate).socketEngine + 0x138))();
  if (cVar1 == '\0') {
    iVar2 = (**(code **)(*(long *)&this->super_QTcpServerPrivate + 0x28))(this);
    if (iVar2 < (this->super_QTcpServerPrivate).maxConnections) {
      QTcpServer::resumeAccepting(this_00);
      return;
    }
  }
  return;
}

Assistant:

void QSslServerPrivate::handleHandshakeTimedOut(QSslSocket *socket)
{
    Q_Q(QSslServer);
    removeSocketData(quintptr(socket));
    socket->disconnectFromHost();
    Q_EMIT q->errorOccurred(socket, QAbstractSocket::SocketTimeoutError);
    socket->deleteLater();
    if (!socketEngine->isReadNotificationEnabled() && totalPendingConnections() < maxConnections)
        q->resumeAccepting();
}